

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O3

void __thiscall
ThreadPoolTest_initialSizeDefined_Test::~ThreadPoolTest_initialSizeDefined_Test
          (ThreadPoolTest_initialSizeDefined_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ThreadPoolTest, initialSizeDefined) {
	thread_pool pool{ 7 };

	EXPECT_EQ(pool.threads(), 7U);
	std::this_thread::sleep_for(10ms);
	EXPECT_EQ(pool.active(), 0U);

	pool.join();

	EXPECT_EQ(pool.active(), 0U);
	EXPECT_EQ(pool.threads(), 0U);
}